

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolJPolValPair.cpp
# Opt level: O0

void __thiscall PolicyPoolJPolValPair::~PolicyPoolJPolValPair(PolicyPoolJPolValPair *this)

{
  pointer psVar1;
  size_type sVar2;
  priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
  *in_RDI;
  
  (in_RDI->c).
  super__Vector_base<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__PolicyPoolJPolValPair_00d136c0;
  while( true ) {
    sVar2 = std::
            priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
            ::size((priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
                    *)0x974fef);
    if (sVar2 == 0) break;
    std::
    priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
    ::pop(in_RDI);
  }
  psVar1 = (in_RDI->c).
           super__Vector_base<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 != (pointer)0x0) {
    std::
    priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
    ::~priority_queue((priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
                       *)0x975031);
    operator_delete(psVar1,0x20);
  }
  PolicyPoolInterface::~PolicyPoolInterface((PolicyPoolInterface *)in_RDI);
  return;
}

Assistant:

PolicyPoolJPolValPair::~PolicyPoolJPolValPair()
{
    while(_m_jpvpQueue_p->size() > 0)
    {
//        delete _m_jpvpQueue_p->top();
        _m_jpvpQueue_p->pop();
    }
    delete _m_jpvpQueue_p;
}